

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>::
emplaceValue<QtInstallDirectoryWithTriple>
          (Node<QString,_QtInstallDirectoryWithTriple> *this,QtInstallDirectoryWithTriple *args)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  QArrayData *pQVar5;
  Data<QHashPrivate::Node<QString,_QString>_> *__old_val;
  long in_FS_OFFSET;
  QHash<QString,_QString> moved;
  QHash<QString,_QString> local_60;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  QHash<QString,_QString> local_40;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  bool local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (args->qtInstallDirectory).d.d;
  (args->qtInstallDirectory).d.d = (Data *)0x0;
  pcVar2 = (args->qtInstallDirectory).d.ptr;
  (args->qtInstallDirectory).d.ptr = (char16_t *)0x0;
  qVar3 = (args->qtInstallDirectory).d.size;
  (args->qtInstallDirectory).d.size = 0;
  pDVar4 = (args->qtDirectories).d;
  (args->qtDirectories).d = (Data *)0x0;
  local_38 = &((args->triple).d.d)->super_QArrayData;
  pcStack_30 = (args->triple).d.ptr;
  (args->triple).d.d = (Data *)0x0;
  (args->triple).d.ptr = (char16_t *)0x0;
  local_28 = (args->triple).d.size;
  (args->triple).d.size = 0;
  local_20 = args->enabled;
  local_58 = &((this->value).qtInstallDirectory.d.d)->super_QArrayData;
  pcStack_50 = (this->value).qtInstallDirectory.d.ptr;
  (this->value).qtInstallDirectory.d.d = pDVar1;
  (this->value).qtInstallDirectory.d.ptr = pcVar2;
  local_48 = (this->value).qtInstallDirectory.d.size;
  (this->value).qtInstallDirectory.d.size = qVar3;
  local_40.d = (Data *)0x0;
  local_60.d = (this->value).qtDirectories.d;
  (this->value).qtDirectories.d = pDVar4;
  QHash<QString,_QString>::~QHash(&local_60);
  pQVar5 = &((this->value).triple.d.d)->super_QArrayData;
  pcVar2 = (this->value).triple.d.ptr;
  (this->value).triple.d.d = (Data *)local_38;
  (this->value).triple.d.ptr = pcStack_30;
  qVar3 = (this->value).triple.d.size;
  (this->value).triple.d.size = local_28;
  (this->value).enabled = local_20;
  local_38 = pQVar5;
  pcStack_30 = pcVar2;
  local_28 = qVar3;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  QHash<QString,_QString>::~QHash(&local_40);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }